

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit
          (PostResolutionChecks *this,QualifiedIdentifier *qi)

{
  Expression *pEVar1;
  IdentifierPath local_a8;
  CompileMessage local_50;
  QualifiedIdentifier *local_18;
  QualifiedIdentifier *qi_local;
  PostResolutionChecks *this_local;
  
  local_18 = qi;
  qi_local = (QualifiedIdentifier *)this;
  ASTVisitor::visit(&this->super_ASTVisitor,qi);
  pEVar1 = &local_18->super_Expression;
  AST::QualifiedIdentifier::getPath(&local_a8,local_18);
  Errors::unresolvedSymbol<soul::IdentifierPath>(&local_50,&local_a8);
  AST::Context::throwError(&(pEVar1->super_Statement).super_ASTObject.context,&local_50,false);
}

Assistant:

void visit (AST::QualifiedIdentifier& qi) override
        {
            super::visit (qi);
            qi.context.throwError (Errors::unresolvedSymbol (qi.getPath()));
        }